

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O2

void __thiscall cmMakefile::AddTestGenerator(cmMakefile *this,cmTestGenerator *g)

{
  cmTestGenerator *local_8;
  
  if (g != (cmTestGenerator *)0x0) {
    local_8 = g;
    std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::push_back
              (&this->TestGenerators,&local_8);
  }
  return;
}

Assistant:

void AddTestGenerator(cmTestGenerator* g)
    { if(g) this->TestGenerators.push_back(g); }